

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void __thiscall log_queue::stop(log_queue *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Map_pointer ppplVar2;
  _Elt_pointer pplVar3;
  log_entry *plVar4;
  pointer pcVar5;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->queue_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  this->active = false;
  while (ppplVar2 = (this->queue).c.
                    super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,
        pplVar3 = (this->queue).c.
                  super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        ((long)(this->queue).c.
               super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last - (long)pplVar3 >> 3) +
        ((long)(this->queue).c.
               super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->queue).c.
               super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)ppplVar2 -
                  (long)(this->queue).c.
                        super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppplVar2 == (_Map_pointer)0x0)) * 0x40 != 0) {
    plVar4 = *pplVar3;
    std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::pop_front
              ((deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)this);
    if (plVar4 != (log_entry *)0x0) {
      pcVar5 = (plVar4->message)._M_dataplus._M_p;
      paVar1 = &(plVar4->message).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != paVar1) {
        operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
      }
      pcVar5 = (plVar4->tag)._M_dataplus._M_p;
      paVar1 = &(plVar4->tag).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != paVar1) {
        operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(plVar4,0x48);
    }
  }
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void stop() {
            std::unique_lock<std::mutex> lock(queue_mutex);
            active = false;

            while (queue.size() > 0) {
                log_entry* top = queue.front();
                queue.pop();
                delete top;
            }

            wait_for_next_item_condition.notify_all();
        }